

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volid_test.cpp
# Opt level: O0

void __thiscall generated_identifiers_stability::test_method(generated_identifiers_stability *this)

{
  unit_test_log_t *puVar1;
  byte bVar2;
  bool bVar3;
  FUNCTION_RETURN FVar4;
  basic_wrap_stringstream<char> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  reference pvVar7;
  lazy_ostream *plVar8;
  size_type sVar9;
  char *__src;
  bool local_e81;
  undefined4 local_e64;
  basic_cstring<const_char> local_e60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e50;
  basic_cstring<const_char> local_e28;
  basic_cstring<const_char> local_e18;
  basic_wrap_stringstream<char> local_e08;
  basic_cstring<const_char> local_c70;
  basic_cstring<const_char> local_c60;
  EVENT_TYPE local_c4c;
  char local_c48 [4];
  EVENT_TYPE val_result;
  PcSignature pcsig;
  uint local_c28;
  int local_c24;
  uint i_1;
  int j;
  basic_cstring<const_char> local_a88;
  basic_cstring<const_char> local_a78;
  basic_cstring<const_char> local_a68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a58;
  assertion_result local_a38;
  basic_cstring<const_char> local_a20;
  basic_cstring<const_char> local_a10;
  string local_a00;
  allocator local_9d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  undefined1 local_918 [8];
  string message;
  char local_828 [4];
  FUNCTION_RETURN generate_ok;
  PcSignature generated_identifier;
  undefined1 local_808 [4];
  int i;
  basic_cstring<const_char> local_670;
  basic_cstring<const_char> local_660;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_649;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_648;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_618;
  undefined1 local_5e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reference_signatures;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  start;
  ifstream is;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_358;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_341;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_340;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_310;
  undefined1 local_2e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reference_signatures_1;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end_1;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  start_1;
  ifstream test_idfile_exist;
  IDENTIFICATION_STRATEGY IStack_58;
  int num_strategies;
  IDENTIFICATION_STRATEGY strategies [4];
  allocator local_31;
  undefined1 local_30 [8];
  string idfileLocation;
  generated_identifiers_stability *this_local;
  
  idfileLocation.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"Testing/Temporary/identifiers_file",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  _IStack_58 = 0x400000000;
  strategies[0] = DISK_NUM;
  strategies[1] = ETHERNET;
  std::ifstream::ifstream(&start_1._M_ok,(string *)local_30,_S_in);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    generate_reference_file((string *)local_30,&IStack_58,4);
  }
  else {
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)&end_1._M_ok,(istream_type *)&start_1._M_ok);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)&reference_signatures_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&local_310,
                       (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)&end_1._M_ok);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&local_340,
                       (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)&reference_signatures_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_341);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2e0,
               &local_310,&local_340,&local_341);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_341);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator(&local_340);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator(&local_310);
    std::ifstream::close();
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e0);
    local_e81 = true;
    if (sVar9 == 4) {
      local_358._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e0);
      local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2e0);
      local_350 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                            (local_358,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_360,(char (*) [20])"0000-0000-0000-0000");
      local_368._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2e0);
      local_e81 = __gnu_cxx::operator!=(&local_350,&local_368);
    }
    if (local_e81 != false) {
      generate_reference_file((string *)local_30,&IStack_58,4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e0);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                         *)&reference_signatures_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                         *)&end_1._M_ok);
  }
  std::ifstream::ifstream(&start._M_ok,(string *)local_30,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)&end._M_ok,(istream_type *)&start._M_ok);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)&reference_signatures.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_618,
                     (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)&end._M_ok);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_648,
                     (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)&reference_signatures.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_649);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5e8,
             &local_618,&local_648,&local_649);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_649);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_648);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_618);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_660,
             "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
             ,0x75);
  memset((basic_wrap_stringstream<char> *)local_808,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_808);
  pbVar5 = boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_808);
  pbVar5 = boost::operator<<(pbVar5,(char (*) [54])
                                    "Generating current signatures and comparing with past");
  pbVar6 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar5);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_670,pbVar6);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_660,0x57,&local_670);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_808);
  stack0xfffffffffffff7f4 = 0;
  while( true ) {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    if (3 < stack0xfffffffffffff7f4) {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_a78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                 ,0x75);
      memset((basic_wrap_stringstream<char> *)&i_1,0,0x198);
      boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
                ((basic_wrap_stringstream<char> *)&i_1);
      pbVar5 = boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)&i_1);
      pbVar5 = boost::operator<<(pbVar5,(char (*) [21])"Verifying signatures");
      pbVar6 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar5);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a88,pbVar6);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a78,0x69,&local_a88);
      boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
                ((basic_wrap_stringstream<char> *)&i_1);
      for (local_c24 = 0; local_c24 < 100; local_c24 = local_c24 + 1) {
        for (local_c28 = 0;
            sVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_5e8), local_c28 < sVar9; local_c28 = local_c28 + 1) {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_5e8,(ulong)local_c28);
          bVar3 = std::operator==(pvVar7,"0000-0000-0000-0000");
          if (!bVar3) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_5e8,(ulong)local_c28);
            __src = (char *)std::__cxx11::string::c_str();
            strncpy(local_c48,__src,0x14);
            local_c4c = validate_pc_signature(local_c48);
            puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      (&local_c60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                       ,0x75);
            memset(&local_e08,0,0x198);
            boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_e08);
            pbVar5 = boost::basic_wrap_stringstream<char>::ref(&local_e08);
            pbVar5 = boost::operator<<(pbVar5,(char (*) [22])"Verifying signature: ");
            pbVar6 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar5);
            boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c70,pbVar6);
            boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c60,0x72,&local_c70);
            boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_e08);
            do {
              puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        (&local_e18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                         ,0x75);
              boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e28);
              boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_e18,0x73,&local_e28);
              plVar8 = boost::unit_test::lazy_ostream::instance();
              boost::unit_test::operator<<(&local_e50,plVar8,(char (*) [1])"");
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        (&local_e60,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                         ,0x75);
              local_e64 = 0;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,EVENT_TYPE,EVENT_TYPE>
                        (&local_e50,&local_e60,0x73,1,2,&local_c4c,"val_result",&local_e64,
                         "LICENSE_OK");
              boost::unit_test::
              lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
              ~lazy_ostream_impl(&local_e50);
              bVar3 = boost::test_tools::tt_detail::dummy_cond();
            } while (bVar3);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5e8);
      std::
      istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
      ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                           *)&reference_signatures.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
      ::~istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                           *)&end._M_ok);
      std::ifstream::~ifstream(&start._M_ok);
      std::ifstream::~ifstream(&start_1._M_ok);
      std::__cxx11::string::~string((string *)local_30);
      return;
    }
    FVar4 = generate_user_pc_signature(local_828,(&IStack_58)[stack0xfffffffffffff7f4]);
    if (FVar4 != FUNC_RET_OK) break;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_5e8,(long)stack0xfffffffffffff7f4);
    bVar3 = std::operator!=(pvVar7,local_828);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_9d8,"pc signature compare fail: strategy: ",&local_9d9);
      std::__cxx11::to_string(&local_a00,(ulong)(&IStack_58)[stack0xfffffffffffff7f4]);
      std::operator+(&local_9b8,&local_9d8,&local_a00);
      std::operator+(&local_998,&local_9b8," generated: [");
      std::operator+(&local_978,&local_998,local_828);
      std::operator+(&local_958,&local_978,"] reference: [");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5e8,(long)stack0xfffffffffffff7f4);
      std::operator+(&local_938,&local_958,pvVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918,
                     &local_938,"]");
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_998);
      std::__cxx11::string::~string((string *)&local_9b8);
      std::__cxx11::string::~string((string *)&local_a00);
      std::__cxx11::string::~string((string *)&local_9d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
      do {
        puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_a10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                   ,0x75);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a20);
        boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a10,0x66,&local_a20);
        boost::test_tools::assertion_result::assertion_result(&local_a38,false);
        plVar8 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (&local_a58,plVar8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_a68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                   ,0x75);
        boost::test_tools::tt_detail::report_assertion(&local_a38,&local_a58,&local_a68,0x66,1,1,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl(&local_a58);
        boost::test_tools::assertion_result::~assertion_result(&local_a38);
        bVar3 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar3);
      std::__cxx11::string::~string((string *)local_918);
    }
    register0x00000000 = stack0xfffffffffffff7f4 + 1;
  }
  __assert_fail("generate_ok == FUNCTION_RETURN::FUNC_RET_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                ,0x5c,"void generated_identifiers_stability::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(generated_identifiers_stability) {
	const string idfileLocation(PROJECT_TEST_TEMP_DIR "/identifiers_file");
	IDENTIFICATION_STRATEGY strategies[] =
			{ DEFAULT,
					DISK_LABEL,
					DISK_NUM,
					ETHERNET };
	const int num_strategies = sizeof(strategies) / sizeof(strategies[0]);
	std::ifstream test_idfile_exist(idfileLocation);
    if (!test_idfile_exist.good()){
        generate_reference_file(idfileLocation, strategies, num_strategies);
    }
    else{
        std::istream_iterator<string> start(test_idfile_exist), end;
        std::vector<string> reference_signatures(start, end);
        test_idfile_exist.close();
        if (reference_signatures.size() != num_strategies ||
            std::find(reference_signatures.begin(), reference_signatures.end(), "0000-0000-0000-0000") != reference_signatures.end())
            generate_reference_file(idfileLocation, strategies, num_strategies);
    }
    std::ifstream is(idfileLocation);
    std::istream_iterator<string> start(is), end;
    std::vector<string> reference_signatures(start, end);
	BOOST_TEST_CHECKPOINT("Generating current signatures and comparing with past");
	for (int i = 0; i < num_strategies; i++) {
        PcSignature generated_identifier;
		FUNCTION_RETURN generate_ok = generate_user_pc_signature(
				generated_identifier, strategies[i]);
		BOOST_ASSERT(generate_ok == FUNCTION_RETURN::FUNC_RET_OK);
        if (generate_ok != FUNC_RET_OK){
			BOOST_ERROR("Generating identifier for strategy " << strategies[i] << " failed with: " << generate_ok);
            continue;
        }
		if (reference_signatures[i] != generated_identifier) {
			string message = string("pc signature compare fail: strategy: ")
					+ to_string(static_cast<long long>(strategies[i])) + " generated: ["
					+ generated_identifier + "] reference: ["
					+ reference_signatures[i] + "]";
			BOOST_ERROR(message);
		}
	}
	BOOST_TEST_CHECKPOINT("Verifying signatures");
	for (int j = 0; j < 100; j++) {
		for (unsigned int i = 0; i < reference_signatures.size(); i++) {
            if (reference_signatures[i] == "0000-0000-0000-0000")
                continue;
			PcSignature pcsig;
			strncpy(pcsig, reference_signatures[i].c_str(),
					sizeof(PcSignature)-1);
			EVENT_TYPE val_result = validate_pc_signature(pcsig);
			BOOST_TEST_CHECKPOINT("Verifying signature: ");
			BOOST_CHECK_EQUAL(val_result, LICENSE_OK);
		}
	}
}